

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::StatusParser::DoPath(StatusParser *this,char path_status,char prop_status,string *path)

{
  char local_31;
  char status;
  string *path_local;
  char prop_status_local;
  char path_status_local;
  StatusParser *this_local;
  
  local_31 = prop_status;
  if (path_status != ' ') {
    local_31 = path_status;
  }
  switch(local_31) {
  case ' ':
  case '?':
  case 'I':
  case 'X':
  default:
    break;
  case '!':
  case 'A':
  case 'D':
  case 'M':
  case 'R':
    (*(this->SVN->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this->SVN,1,path);
    break;
  case 'C':
  case '~':
    (*(this->SVN->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this->SVN,2,path);
  }
  return;
}

Assistant:

void DoPath(char path_status, char prop_status, std::string const& path)
  {
    char status = (path_status != ' ') ? path_status : prop_status;
    // See "svn help status".
    switch (status) {
      case 'M':
      case '!':
      case 'A':
      case 'D':
      case 'R':
        this->SVN->DoModification(PathModified, path);
        break;
      case 'C':
      case '~':
        this->SVN->DoModification(PathConflicting, path);
        break;
      case 'X':
      case 'I':
      case '?':
      case ' ':
      default:
        break;
    }
  }